

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

bool ImGui::IsRectVisible(ImVec2 *rect_min,ImVec2 *rect_max)

{
  bool bVar1;
  ImRect *this;
  ImRect local_30;
  ImGuiWindow *local_20;
  ImGuiWindow *window;
  ImVec2 *rect_max_local;
  ImVec2 *rect_min_local;
  
  local_20 = GImGui->CurrentWindow;
  this = &local_20->ClipRect;
  window = (ImGuiWindow *)rect_max;
  rect_max_local = rect_min;
  ImRect::ImRect(&local_30,rect_min,rect_max);
  bVar1 = ImRect::Overlaps(this,&local_30);
  return bVar1;
}

Assistant:

bool ImGui::IsRectVisible(const ImVec2& rect_min, const ImVec2& rect_max)
{
    ImGuiWindow* window = GImGui->CurrentWindow;
    return window->ClipRect.Overlaps(ImRect(rect_min, rect_max));
}